

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall LatencyCollector::LatencyCollector(LatencyCollector *this)

{
  MapWrapper *src_ptr;
  ashared_ptr<MapWrapper> local_40;
  
  *(undefined8 *)((long)&(this->latestMap).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->latestMap).lock.super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->latestMap).object._M_b._M_p = (__pointer_type)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->latestMap).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  src_ptr = (MapWrapper *)operator_new(0x38);
  (src_ptr->map)._M_h._M_buckets = &(src_ptr->map)._M_h._M_single_bucket;
  (src_ptr->map)._M_h._M_bucket_count = 1;
  (src_ptr->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (src_ptr->map)._M_h._M_element_count = 0;
  (src_ptr->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (src_ptr->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (src_ptr->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ashared_ptr<MapWrapper>::ashared_ptr(&local_40,src_ptr);
  ashared_ptr<MapWrapper>::operator=(&this->latestMap,&local_40);
  ashared_ptr<MapWrapper>::~ashared_ptr(&local_40);
  return;
}

Assistant:

LatencyCollector() {
        latestMap = MapWrapperSP(new MapWrapper());
    }